

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void GA_Set_block_cyclic_proc_grid64(int g_a,int64_t *block,int64_t *proc_grid)

{
  long in_RDX;
  long in_RSI;
  int in_EDI;
  int i_1;
  int i;
  Integer _ga_lo [7];
  Integer _ga_dims [7];
  Integer ndim;
  Integer aa;
  int local_b0;
  int local_ac;
  undefined8 local_a8;
  Integer *in_stack_ffffffffffffff60;
  Integer *in_stack_ffffffffffffff68;
  Integer in_stack_ffffffffffffff70;
  undefined8 local_68 [8];
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_20 = (long)in_EDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28 = pnga_get_dimension(local_20);
  for (local_ac = 0; local_ac < local_28; local_ac = local_ac + 1) {
    local_68[(local_28 - local_ac) + -1] = *(undefined8 *)(local_10 + (long)local_ac * 8);
  }
  for (local_b0 = 0; local_b0 < local_28; local_b0 = local_b0 + 1) {
    (&local_a8)[(local_28 - local_b0) + -1] = *(undefined8 *)(local_18 + (long)local_b0 * 8);
  }
  pnga_set_block_cyclic_proc_grid
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  return;
}

Assistant:

void GA_Set_block_cyclic_proc_grid64(int g_a, int64_t block[], int64_t proc_grid[])
{
    Integer aa, ndim;
    Integer _ga_dims[MAXDIM];
    Integer _ga_lo[MAXDIM];
    aa = (Integer)g_a;
    ndim = wnga_get_dimension(aa);
    COPYC2F(block,_ga_dims, ndim);
    COPYC2F(proc_grid,_ga_lo, ndim);
    wnga_set_block_cyclic_proc_grid(aa, _ga_dims, _ga_lo);
}